

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O3

int cm_zlib_gzclose_r(gzFile file)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = 0xfffffffe;
  if ((file != (gzFile)0x0) && (file[1].have == 0x1c4f)) {
    if ((int)file[1].pos != 0) {
      cm_zlib_inflateEnd((z_streamp)&file[5].next);
      free(file[2].next);
      free(*(void **)(file + 2));
    }
    iVar1 = *(int *)((long)&file[4].pos + 4);
    cm_zlib_gz_error((gz_statep)file,0,(char *)0x0);
    free(file[1].next);
    iVar2 = close(*(int *)&file[1].field_0x4);
    free(file);
    uVar3 = -(uint)(iVar2 != 0) | (uint)(iVar1 != -5) * 5 - 5;
  }
  return uVar3;
}

Assistant:

int ZEXPORT gzclose_r(file)
    gzFile file;
{
    int ret, err;
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_statep)file;

    /* check that we're reading */
    if (state->mode != GZ_READ)
        return Z_STREAM_ERROR;

    /* free memory and close file */
    if (state->size) {
        inflateEnd(&(state->strm));
        free(state->out);
        free(state->in);
    }
    err = state->err == Z_BUF_ERROR ? Z_BUF_ERROR : Z_OK;
    gz_error(state, Z_OK, NULL);
    free(state->path);
    ret = close(state->fd);
    free(state);
    return ret ? Z_ERRNO : err;
}